

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

void gost_cnt_next(void *ctx,uchar *iv,uchar *buf)

{
  ulong in_RAX;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  undefined8 local_28;
  
  local_28 = in_RAX;
  if ((*(int *)((long)ctx + 8) != 0) && (*(int *)((long)ctx + 4) == 0x400)) {
    cryptopro_key_meshing((gost_ctx *)((long)ctx + 0x1c),iv);
  }
  if (*(int *)((long)ctx + 4) == 0) {
    gostcrypt((gost_ctx *)((long)ctx + 0x1c),iv,(byte *)&local_28);
    uVar1 = local_28 & 0xffffffff;
  }
  else {
    uVar1 = *(ulong *)iv;
    local_28._4_2_ = (undefined2)(uVar1 >> 0x20);
    local_28._6_1_ = (undefined1)(uVar1 >> 0x30);
    local_28._7_1_ = (undefined1)(uVar1 >> 0x38);
  }
  uVar2 = CONCAT13(local_28._7_1_,CONCAT12(local_28._6_1_,local_28._4_2_));
  iVar3 = (uVar2 - (uVar2 < 0xfefefefc)) + 0x1010105;
  local_28 = CONCAT17((char)((uint)iVar3 >> 0x18),
                      CONCAT16((char)((uint)iVar3 >> 0x10),
                               CONCAT15((char)((uint)iVar3 >> 8),
                                        CONCAT14((char)iVar3,(int)uVar1 + 0x1010101))));
  *(ulong *)iv = local_28;
  gostcrypt((gost_ctx *)((long)ctx + 0x1c),(byte *)&local_28,buf);
  *(uint *)((long)ctx + 4) = (*(uint *)((long)ctx + 4) & 0x3ff) + 8;
  return;
}

Assistant:

static void gost_cnt_next(void *ctx, unsigned char *iv, unsigned char *buf)
{
    struct ossl_gost_cipher_ctx *c = ctx;
    word32 g, go;
    unsigned char buf1[8];
    assert(c->count % 8 == 0 && c->count <= 1024);
    if (c->key_meshing && c->count == 1024) {
        cryptopro_key_meshing(&(c->cctx), iv);
    }
    if (c->count == 0) {
        gostcrypt(&(c->cctx), iv, buf1);
    } else {
        memcpy(buf1, iv, 8);
    }
    g = buf1[0] | (buf1[1] << 8) | (buf1[2] << 16) | ((word32) buf1[3] << 24);
    g += 0x01010101;
    buf1[0] = (unsigned char)(g & 0xff);
    buf1[1] = (unsigned char)((g >> 8) & 0xff);
    buf1[2] = (unsigned char)((g >> 16) & 0xff);
    buf1[3] = (unsigned char)((g >> 24) & 0xff);
    g = buf1[4] | (buf1[5] << 8) | (buf1[6] << 16) | ((word32) buf1[7] << 24);
    go = g;
    g += 0x01010104;
    if (go > g)                 /* overflow */
        g++;
    buf1[4] = (unsigned char)(g & 0xff);
    buf1[5] = (unsigned char)((g >> 8) & 0xff);
    buf1[6] = (unsigned char)((g >> 16) & 0xff);
    buf1[7] = (unsigned char)((g >> 24) & 0xff);
    memcpy(iv, buf1, 8);
    gostcrypt(&(c->cctx), buf1, buf);
    c->count = c->count % 1024 + 8;
}